

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O0

void ctx_prep(disisa *isa)

{
  int iVar1;
  int f;
  int f_00;
  int iVar2;
  int v;
  int v_00;
  vardata *pvVar3;
  int v_g200;
  int v_g80;
  int v_nv40;
  int vs_chipset;
  int f_callret;
  int f_g80op;
  int f_nv40op;
  disisa *isa_local;
  
  pvVar3 = vardata_new("ctxisa");
  isa->vardata = pvVar3;
  iVar1 = vardata_add_feature(isa->vardata,"nv40op","NV40 family exclusive opcodes");
  f = vardata_add_feature(isa->vardata,"g80op","G80 family exclusive opcodes");
  f_00 = vardata_add_feature(isa->vardata,"callret","call and ret ops");
  if (((iVar1 == -1) || (f == -1)) || (f_00 == -1)) {
    abort();
  }
  iVar2 = vardata_add_varset(isa->vardata,"chipset","GPU chipset");
  if (iVar2 == -1) {
    abort();
  }
  v = vardata_add_variant(isa->vardata,"nv40","NV40:G80",iVar2);
  v_00 = vardata_add_variant(isa->vardata,"g80","G80:G200",iVar2);
  iVar2 = vardata_add_variant(isa->vardata,"g200","G200:GF100",iVar2);
  if (((v != -1) && (v_00 != -1)) && (iVar2 != -1)) {
    vardata_variant_feature(isa->vardata,v,iVar1);
    vardata_variant_feature(isa->vardata,v_00,f);
    vardata_variant_feature(isa->vardata,iVar2,f);
    vardata_variant_feature(isa->vardata,iVar2,f_00);
    iVar1 = vardata_validate(isa->vardata);
    if (iVar1 != 0) {
      abort();
    }
    return;
  }
  abort();
}

Assistant:

static void ctx_prep(struct disisa *isa) {
	isa->vardata = vardata_new("ctxisa");
	int f_nv40op = vardata_add_feature(isa->vardata, "nv40op", "NV40 family exclusive opcodes");
	int f_g80op = vardata_add_feature(isa->vardata, "g80op", "G80 family exclusive opcodes");
	int f_callret = vardata_add_feature(isa->vardata, "callret", "call and ret ops");
	if (f_nv40op == -1 || f_g80op == -1 || f_callret == -1)
		abort();
	int vs_chipset = vardata_add_varset(isa->vardata, "chipset", "GPU chipset");
	if (vs_chipset == -1)
		abort();
	int v_nv40 = vardata_add_variant(isa->vardata, "nv40", "NV40:G80", vs_chipset);
	int v_g80 = vardata_add_variant(isa->vardata, "g80", "G80:G200", vs_chipset);
	int v_g200 = vardata_add_variant(isa->vardata, "g200", "G200:GF100", vs_chipset);
	if (v_nv40 == -1 || v_g80 == -1 || v_g200 == -1)
		abort();
	vardata_variant_feature(isa->vardata, v_nv40, f_nv40op);
	vardata_variant_feature(isa->vardata, v_g80, f_g80op);
	vardata_variant_feature(isa->vardata, v_g200, f_g80op);
	vardata_variant_feature(isa->vardata, v_g200, f_callret);
	if (vardata_validate(isa->vardata))
		abort();
}